

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  stbi_uc sVar9;
  int num;
  char *pcVar10;
  stbi_uc *psVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  stbi_uc local_a08 [31];
  byte bStack_9e9;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar7 = a->zbuffer;
    uVar1 = 0;
    if (pbVar7 < a->zbuffer_end) {
      a->zbuffer = pbVar7 + 1;
      uVar2 = (uint)*pbVar7;
      pbVar7 = pbVar7 + 1;
    }
    else {
      uVar2 = 0;
    }
    if (pbVar7 < a->zbuffer_end) {
      a->zbuffer = pbVar7 + 1;
      uVar1 = (uint)*pbVar7;
    }
    if ((short)((uVar2 << 8 | uVar1) % 0x1f) != 0) {
      stbi__g_failure_reason = "bad zlib header";
      return 0;
    }
    if ((uVar1 & 0x20) != 0) {
      stbi__g_failure_reason = "no preset dict";
      return 0;
    }
    if ((uVar2 & 0xf) != 8) {
      stbi__g_failure_reason = "bad compression";
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  z = &a->z_length;
  do {
    uVar1 = stbi__zreceive(a,1);
    uVar2 = stbi__zreceive(a,2);
    if (uVar2 == 0) {
      uVar2 = a->num_bits;
      if ((uVar2 & 7) != 0) {
        stbi__zreceive(a,uVar2 & 7);
        uVar2 = a->num_bits;
      }
      uVar14 = 0;
      while (0 < (int)uVar2) {
        uVar3 = a->code_buffer;
        uVar2 = uVar2 - 8;
        *(char *)((long)z_codelength.fast + uVar14) = (char)uVar3;
        uVar14 = uVar14 + 1;
        a->code_buffer = uVar3 >> 8;
        a->num_bits = uVar2;
      }
      if (uVar2 != 0) {
        __assert_fail("a->num_bits == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                      ,0x1035,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
      }
      for (; uVar14 < 4; uVar14 = uVar14 + 1) {
        psVar11 = a->zbuffer;
        if (psVar11 < a->zbuffer_end) {
          a->zbuffer = psVar11 + 1;
          sVar9 = *psVar11;
        }
        else {
          sVar9 = '\0';
        }
        *(stbi_uc *)((long)z_codelength.fast + uVar14) = sVar9;
      }
      if ((z_codelength.fast[1] ^ z_codelength.fast[0]) != 0xffff) {
        stbi__g_failure_reason = "zlib corrupt";
        return 0;
      }
      psVar11 = a->zbuffer;
      uVar14 = (ulong)z_codelength.fast[0];
      if (a->zbuffer_end < psVar11 + uVar14) {
        stbi__g_failure_reason = "read past buffer";
        return 0;
      }
      pcVar10 = a->zout;
      if (a->zout_end < pcVar10 + uVar14) {
        iVar6 = stbi__zexpand(a,pcVar10,(uint)z_codelength.fast[0]);
        if (iVar6 == 0) {
          return 0;
        }
        psVar11 = a->zbuffer;
        pcVar10 = a->zout;
      }
      memcpy(pcVar10,psVar11,uVar14);
      a->zbuffer = a->zbuffer + uVar14;
      a->zout = a->zout + uVar14;
    }
    else {
      if (uVar2 == 1) {
        iVar6 = stbi__zbuild_huffman
                          (z,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                           ,0x120);
        if (iVar6 == 0) {
          return 0;
        }
        psVar11 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        num = 0x20;
      }
      else {
        if (uVar2 == 3) {
          return 0;
        }
        uVar2 = stbi__zreceive(a,5);
        uVar3 = stbi__zreceive(a,5);
        uVar4 = stbi__zreceive(a,4);
        local_a08[0] = '\0';
        local_a08[1] = '\0';
        local_a08[2] = '\0';
        local_a08[3] = '\0';
        local_a08[4] = '\0';
        local_a08[5] = '\0';
        local_a08[6] = '\0';
        local_a08[7] = '\0';
        local_a08[8] = '\0';
        local_a08[9] = '\0';
        local_a08[10] = '\0';
        local_a08[0xb] = '\0';
        local_a08[0xc] = '\0';
        local_a08[0xd] = '\0';
        local_a08[0xe] = '\0';
        local_a08[0xf] = '\0';
        local_a08[0x10] = '\0';
        local_a08[0x11] = '\0';
        local_a08[0x12] = '\0';
        for (uVar14 = 0; (~((int)(uVar4 + 4) >> 0x1f) & uVar4 + 4) != uVar14; uVar14 = uVar14 + 1) {
          uVar5 = stbi__zreceive(a,3);
          local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar14]] =
               (stbi_uc)uVar5;
        }
        iVar6 = stbi__zbuild_huffman(&z_codelength,local_a08,0x13);
        if (iVar6 == 0) {
          return 0;
        }
        iVar6 = uVar3 + 0x102 + uVar2;
        num = uVar3 + 1;
        iVar13 = 0;
        while( true ) {
          if (iVar6 <= iVar13) break;
          uVar3 = stbi__zhuffman_decode(a,&z_codelength);
          if (0x12 < uVar3) goto LAB_0018b462;
          if (uVar3 < 0x10) {
            lencodes[iVar13] = (stbi_uc)uVar3;
            iVar13 = iVar13 + 1;
          }
          else {
            if (uVar3 == 0x11) {
              uVar3 = stbi__zreceive(a,3);
              iVar12 = uVar3 + 3;
LAB_0018b1a1:
              uVar3 = 0;
            }
            else {
              if (uVar3 != 0x10) {
                uVar3 = stbi__zreceive(a,7);
                iVar12 = uVar3 + 0xb;
                goto LAB_0018b1a1;
              }
              uVar3 = stbi__zreceive(a,2);
              if (iVar13 == 0) goto LAB_0018b462;
              iVar12 = uVar3 + 3;
              uVar3 = (uint)lencodes[(long)iVar13 + -1];
            }
            if (iVar6 - iVar13 < iVar12) goto LAB_0018b462;
            memset(lencodes + iVar13,uVar3,(long)iVar12);
            iVar13 = iVar13 + iVar12;
          }
        }
        if (iVar6 != iVar13) {
LAB_0018b462:
          stbi__g_failure_reason = "bad codelengths";
          return 0;
        }
        iVar6 = stbi__zbuild_huffman(z,lencodes,uVar2 + 0x101);
        if (iVar6 == 0) {
          return 0;
        }
        psVar11 = lencodes + (int)(uVar2 + 0x101);
      }
      iVar6 = stbi__zbuild_huffman(&a->z_distance,psVar11,num);
      if (iVar6 == 0) {
        return 0;
      }
      pcVar10 = a->zout;
      while( true ) {
        while (iVar6 = stbi__zhuffman_decode(a,z), iVar6 < 0x100) {
          if (iVar6 < 0) goto LAB_0018b46b;
          if (a->zout_end <= pcVar10) {
            iVar13 = stbi__zexpand(a,pcVar10,1);
            if (iVar13 == 0) {
              return 0;
            }
            pcVar10 = a->zout;
          }
          *pcVar10 = (char)iVar6;
          pcVar10 = pcVar10 + 1;
        }
        if (iVar6 == 0x100) break;
        uVar14 = (ulong)(iVar6 - 0x101);
        uVar2 = stbi__zlength_base[uVar14];
        if (0xffffffffffffffeb < uVar14 - 0x1c) {
          uVar3 = stbi__zreceive(a,stbi__zlength_extra[uVar14]);
          uVar2 = uVar2 + uVar3;
        }
        uVar3 = stbi__zhuffman_decode(a,&a->z_distance);
        if ((int)uVar3 < 0) {
LAB_0018b46b:
          stbi__g_failure_reason = "bad huffman code";
          return 0;
        }
        uVar14 = (ulong)uVar3;
        iVar6 = stbi__zdist_base[uVar14];
        if (0xffffffffffffffe5 < uVar14 - 0x1e) {
          uVar3 = stbi__zreceive(a,stbi__zdist_extra[uVar14]);
          iVar6 = iVar6 + uVar3;
        }
        if ((long)pcVar10 - (long)a->zout_start < (long)iVar6) {
          stbi__g_failure_reason = "bad dist";
          return 0;
        }
        if (a->zout_end < pcVar10 + (int)uVar2) {
          iVar13 = stbi__zexpand(a,pcVar10,uVar2);
          if (iVar13 == 0) {
            return 0;
          }
          pcVar10 = a->zout;
        }
        lVar8 = -(long)iVar6;
        if (iVar6 == 1) {
          if (uVar2 != 0) {
            memset(pcVar10,(uint)(byte)pcVar10[lVar8],(ulong)uVar2);
            pcVar10 = pcVar10 + (ulong)(uVar2 - 1) + 1;
          }
        }
        else {
          for (; uVar2 != 0; uVar2 = uVar2 - 1) {
            *pcVar10 = pcVar10[lVar8];
            pcVar10 = pcVar10 + 1;
          }
        }
      }
      a->zout = pcVar10;
    }
    if (uVar1 != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}